

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_list_handler.c
# Opt level: O2

ion_err_t sldict_create_dictionary
                    (ion_dictionary_id_t id,ion_key_type_t key_type,ion_key_size_t key_size,
                    ion_value_size_t value_size,ion_dictionary_size_t dictionary_size,
                    ion_dictionary_compare_t compare,ion_dictionary_handler_t *handler,
                    ion_dictionary_t *dictionary)

{
  ion_err_t iVar1;
  ion_skiplist_t *skiplist;
  
  skiplist = (ion_skiplist_t *)malloc(0x38);
  dictionary->instance = (ion_dictionary_parent_t *)skiplist;
  if (skiplist == (ion_skiplist_t *)0x0) {
    iVar1 = '\x06';
  }
  else {
    (skiplist->super).compare = compare;
    (skiplist->super).type = dictionary_type_skip_list_t;
    iVar1 = sl_initialize(skiplist,key_type,key_size,value_size,dictionary_size,1,4);
    if (handler != (ion_dictionary_handler_t *)0x0 && iVar1 == '\0') {
      dictionary->handler = handler;
      iVar1 = '\0';
    }
  }
  return iVar1;
}

Assistant:

ion_err_t
sldict_create_dictionary(
	ion_dictionary_id_t			id,
	ion_key_type_t				key_type,
	ion_key_size_t				key_size,
	ion_value_size_t			value_size,
	ion_dictionary_size_t		dictionary_size,
	ion_dictionary_compare_t	compare,
	ion_dictionary_handler_t	*handler,
	ion_dictionary_t			*dictionary
) {
	UNUSED(id);

	int pnum, pden;

	dictionary->instance = malloc(sizeof(ion_skiplist_t));

	if (NULL == dictionary->instance) {
		return err_out_of_memory;
	}

	dictionary->instance->compare	= compare;
	dictionary->instance->type		= dictionary_type_skip_list_t;

	pnum							= 1;
	pden							= 4;

	ion_err_t result = sl_initialize((ion_skiplist_t *) dictionary->instance, key_type, key_size, value_size, dictionary_size, pnum, pden);

	if ((err_ok == result) && (NULL != handler)) {
		dictionary->handler = handler;
	}

	return result;
}